

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

string * __thiscall
pbrt::ShapeIntersection::ToString_abi_cxx11_(string *__return_storage_ptr__,ShapeIntersection *this)

{
  float *in_R8;
  
  StringPrintf<pbrt::SurfaceInteraction_const&,float_const&>
            (__return_storage_ptr__,(pbrt *)"[ ShapeIntersection intr: %s tHit: %f ]",(char *)this,
             (SurfaceInteraction *)&this->tHit,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string ShapeIntersection::ToString() const {
    return StringPrintf("[ ShapeIntersection intr: %s tHit: %f ]", intr, tHit);
}